

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_TestParamSet_square(uint64_t *out1,uint64_t *arg1)

{
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x175;
  uint64_t x174;
  uint64_t x173;
  uint64_t x172;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x171;
  uint64_t x170;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x169;
  uint64_t x168;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x167;
  uint64_t x166;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x165;
  uint64_t x164;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x163;
  uint64_t x162;
  uint64_t x161;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x160;
  uint64_t x159;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x158;
  uint64_t x157;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x156;
  uint64_t x155;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x154;
  uint64_t x153;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x152;
  uint64_t x151;
  uint64_t x150;
  uint64_t x149;
  uint64_t x148;
  uint64_t x147;
  uint64_t x146;
  uint64_t x145;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x144;
  uint64_t x143;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x142;
  uint64_t x141;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x140;
  uint64_t x139;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x138;
  uint64_t x137;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x136;
  uint64_t x135;
  uint64_t x134;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x133;
  uint64_t x132;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x131;
  uint64_t x130;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x129;
  uint64_t x128;
  uint64_t x127;
  uint64_t x126;
  uint64_t x125;
  uint64_t x124;
  uint64_t x123;
  uint64_t x122;
  uint64_t x121;
  uint64_t x120;
  uint64_t x119;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x118;
  uint64_t x117;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x116;
  uint64_t x115;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x114;
  uint64_t x113;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x112;
  uint64_t x111;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x110;
  uint64_t x109;
  uint64_t x108;
  uint64_t x107;
  uint64_t x106;
  uint64_t x105;
  uint64_t x104;
  uint64_t x103;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x102;
  uint64_t x101;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x100;
  uint64_t x99;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x98;
  uint64_t x97;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x96;
  uint64_t x95;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x94;
  uint64_t x93;
  uint64_t x92;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x91;
  uint64_t x90;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x89;
  uint64_t x88;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x87;
  uint64_t x86;
  uint64_t x85;
  uint64_t x84;
  uint64_t x83;
  uint64_t x82;
  uint64_t x81;
  uint64_t x80;
  uint64_t x79;
  uint64_t x78;
  uint64_t x77;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x76;
  uint64_t x75;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x74;
  uint64_t x73;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x72;
  uint64_t x71;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x70;
  uint64_t x69;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x68;
  uint64_t x67;
  uint64_t x66;
  uint64_t x65;
  uint64_t x64;
  uint64_t x63;
  uint64_t x62;
  uint64_t x61;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x60;
  uint64_t x59;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x58;
  uint64_t x57;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x56;
  uint64_t x55;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x54;
  uint64_t x53;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x52;
  uint64_t x51;
  uint64_t x50;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x49;
  uint64_t x48;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x47;
  uint64_t x46;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x45;
  uint64_t x44;
  uint64_t x43;
  uint64_t x42;
  uint64_t x41;
  uint64_t x40;
  uint64_t x39;
  uint64_t x38;
  uint64_t x37;
  uint64_t x36;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x35;
  uint64_t x34;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x33;
  uint64_t x32;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x31;
  uint64_t x30;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x29;
  uint64_t x28;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x18;
  uint64_t x17;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x16;
  uint64_t x15;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  uint64_t in_stack_fffffffffffffa98;
  uint64_t in_stack_fffffffffffffaa0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_fffffffffffffaaf;
  uint64_t *in_stack_fffffffffffffab0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_541;
  uint64_t local_540;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_531;
  uint64_t local_530;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_521;
  uint64_t local_520;
  uint64_t local_518;
  byte local_509;
  uint64_t local_508;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_4f9;
  uint64_t local_4f8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_4e9;
  uint64_t local_4e8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_4d9;
  uint64_t local_4d8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_4c9;
  uint64_t local_4c8;
  uint64_t local_4c0;
  uint64_t local_4b8;
  uint64_t local_4b0;
  uint64_t local_4a8;
  uint64_t local_4a0;
  uint64_t local_498;
  byte local_489;
  uint64_t local_488;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_479;
  uint64_t local_478;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_469;
  uint64_t local_468;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_459;
  uint64_t local_458;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_449;
  uint64_t local_448;
  uint64_t local_440;
  byte local_431;
  uint64_t local_430;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_421;
  uint64_t local_420;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_411;
  uint64_t local_410;
  uint64_t local_408;
  uint64_t local_400;
  uint64_t local_3f8;
  uint64_t local_3f0;
  uint64_t local_3e8;
  uint64_t local_3e0;
  uint64_t local_3d8;
  uint64_t local_3d0;
  uint64_t local_3c8;
  byte local_3b9;
  uint64_t local_3b8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_3a9;
  uint64_t local_3a8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_399;
  uint64_t local_398;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_389;
  uint64_t local_388;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_379;
  uint64_t local_378;
  uint64_t local_370;
  uint64_t local_368;
  uint64_t local_360;
  uint64_t local_358;
  uint64_t local_350;
  uint64_t local_348;
  byte local_339;
  uint64_t local_338;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_329;
  uint64_t local_328;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_319;
  uint64_t local_318;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_309;
  uint64_t local_308;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_2f9;
  uint64_t local_2f8;
  uint64_t local_2f0;
  byte local_2e1;
  uint64_t local_2e0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_2d1;
  uint64_t local_2d0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_2c1;
  uint64_t local_2c0;
  uint64_t local_2b8;
  uint64_t local_2b0;
  uint64_t local_2a8;
  uint64_t local_2a0;
  uint64_t local_298;
  uint64_t local_290;
  uint64_t local_288;
  uint64_t local_280;
  uint64_t local_278;
  byte local_269;
  uint64_t local_268;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_259;
  uint64_t local_258;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_249;
  uint64_t local_248;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_239;
  uint64_t local_238;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_229;
  uint64_t local_228;
  uint64_t local_220;
  uint64_t local_218;
  uint64_t local_210;
  uint64_t local_208;
  uint64_t local_200;
  uint64_t local_1f8;
  byte local_1e9;
  uint64_t local_1e8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1d9;
  uint64_t local_1d8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1c9;
  uint64_t local_1c8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1b9;
  uint64_t local_1b8;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_1a9;
  uint64_t local_1a8;
  uint64_t local_1a0;
  byte local_191;
  uint64_t local_190;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_181;
  uint64_t local_180;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_171;
  uint64_t local_170;
  uint64_t local_168;
  uint64_t local_160;
  uint64_t local_158;
  uint64_t local_150;
  uint64_t local_148;
  uint64_t local_140;
  uint64_t local_138;
  uint64_t local_130;
  byte local_121;
  uint64_t local_120;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_111;
  uint64_t local_110;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_101;
  uint64_t local_100;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_f1;
  uint64_t local_f0;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_e1;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  byte local_99;
  uint64_t local_98;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_89;
  uint64_t local_88;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_79;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_18 = in_RSI[1];
  local_20 = in_RSI[2];
  local_28 = in_RSI[3];
  local_30 = *in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_38,&local_40,local_30,in_RSI[3]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_48,&local_50,local_30,local_10[2]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_58,&local_60,local_30,local_10[1]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_68,&local_70,local_30,*local_10);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_78,&local_79,'\0',local_70,local_58);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_88,&local_89,local_79,local_60,local_48);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_98,&local_99,local_89,local_50,local_38);
  local_a8 = local_99 + local_40;
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_b0,&local_b8,local_68,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_c0,&local_c8,local_b0,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_d0,&local_d8,local_b0,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_e0,&local_e1,'\0',local_68,local_d0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_f0,&local_f1,local_e1,local_78,local_d8);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_100,&local_101,local_f1,local_88,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_110,&local_111,local_101,local_98,local_c0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_120,&local_121,local_111,local_a8,local_c8);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_130,&local_138,local_18,local_10[3]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_140,&local_148,local_18,local_10[2]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_150,&local_158,local_18,local_10[1]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_160,&local_168,local_18,*local_10);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_170,&local_171,'\0',local_168,local_150);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_180,&local_181,local_171,local_158,local_140);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_190,&local_191,local_181,local_148,local_130);
  local_1a0 = local_191 + local_138;
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_1a8,&local_1a9,'\0',local_f0,local_160);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_1b8,&local_1b9,local_1a9,local_100,local_170);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_1c8,&local_1c9,local_1b9,local_110,local_180);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_1d8,&local_1d9,local_1c9,local_120,local_190);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_1e8,&local_1e9,local_1d9,(ulong)local_121,local_1a0);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_1f8,&local_200,local_1a8,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_208,&local_210,local_1f8,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_218,&local_220,local_1f8,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_228,&local_229,'\0',local_1a8,local_218);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_238,&local_239,local_229,local_1b8,local_220);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_248,&local_249,local_239,local_1c8,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_258,&local_259,local_249,local_1d8,local_208);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_268,&local_269,local_259,local_1e8,local_210);
  local_278 = (ulong)local_269 + (ulong)local_1e9;
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_280,&local_288,local_20,local_10[3]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_290,&local_298,local_20,local_10[2]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_2a0,&local_2a8,local_20,local_10[1]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_2b0,&local_2b8,local_20,*local_10);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_2c0,&local_2c1,'\0',local_2b8,local_2a0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_2d0,&local_2d1,local_2c1,local_2a8,local_290);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_2e0,&local_2e1,local_2d1,local_298,local_280);
  local_2f0 = local_2e1 + local_288;
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_2f8,&local_2f9,'\0',local_238,local_2b0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_308,&local_309,local_2f9,local_248,local_2c0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_318,&local_319,local_309,local_258,local_2d0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_328,&local_329,local_319,local_268,local_2e0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_338,&local_339,local_329,local_278,local_2f0);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_348,&local_350,local_2f8,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_358,&local_360,local_348,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_368,&local_370,local_348,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_378,&local_379,'\0',local_2f8,local_368);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_388,&local_389,local_379,local_308,local_370);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_398,&local_399,local_389,local_318,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_3a8,&local_3a9,local_399,local_328,local_358);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_3b8,&local_3b9,local_3a9,local_338,local_360);
  local_3c8 = (ulong)local_3b9 + (ulong)local_339;
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_3d0,&local_3d8,local_28,local_10[3]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_3e0,&local_3e8,local_28,local_10[2]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_3f0,&local_3f8,local_28,local_10[1]);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_400,&local_408,local_28,*local_10);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_410,&local_411,'\0',local_408,local_3f0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_420,&local_421,local_411,local_3f8,local_3e0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_430,&local_431,local_421,local_3e8,local_3d0);
  local_440 = local_431 + local_3d8;
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_448,&local_449,'\0',local_388,local_400);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_458,&local_459,local_449,local_398,local_410);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_468,&local_469,local_459,local_3a8,local_420);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_478,&local_479,local_469,local_3b8,local_430);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_488,&local_489,local_479,local_3c8,local_440);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_498,&local_4a0,local_448,0xdbf951d5883b2b2f);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_4a8,&local_4b0,local_498,0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&local_4b8,&local_4c0,local_498,0x431);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_4c8,&local_4c9,'\0',local_448,local_4b8);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_4d8,&local_4d9,local_4c9,local_458,local_4c0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_4e8,&local_4e9,local_4d9,local_468,0);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_4f8,&local_4f9,local_4e9,local_478,local_4a8);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_508,&local_509,local_4f9,local_488,local_4b0);
  local_518 = (ulong)local_509 + (ulong)local_489;
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_520,&local_521,'\0',local_4d8,0x431);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_530,&local_531,local_521,local_4e8,0);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_540,&local_541,local_531,local_4f8,0);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffab0,&stack0xfffffffffffffaaf,local_541,local_508,
             0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffffaa0,&stack0xfffffffffffffa9f,in_stack_fffffffffffffaaf
             ,local_518,0);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa0,
             in_stack_fffffffffffffa98);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa0,
             in_stack_fffffffffffffa98);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa0,
             in_stack_fffffffffffffa98);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa0,
             in_stack_fffffffffffffa98);
  *local_8 = local_570;
  local_8[1] = local_578;
  local_8[2] = local_580;
  local_8[3] = local_588;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_square(uint64_t out1[4],
                                                       const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x27;
    uint64_t x28;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x31;
    uint64_t x32;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x45;
    uint64_t x46;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x47;
    uint64_t x48;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x49;
    uint64_t x50;
    uint64_t x51;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x52;
    uint64_t x53;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint64_t x65;
    uint64_t x66;
    uint64_t x67;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x68;
    uint64_t x69;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x70;
    uint64_t x71;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x72;
    uint64_t x73;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x74;
    uint64_t x75;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    uint64_t x83;
    uint64_t x84;
    uint64_t x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x87;
    uint64_t x88;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x89;
    uint64_t x90;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x91;
    uint64_t x92;
    uint64_t x93;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x94;
    uint64_t x95;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x96;
    uint64_t x97;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x98;
    uint64_t x99;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x100;
    uint64_t x101;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    uint64_t x109;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x110;
    uint64_t x111;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x112;
    uint64_t x113;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x114;
    uint64_t x115;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x118;
    uint64_t x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    uint64_t x126;
    uint64_t x127;
    uint64_t x128;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x129;
    uint64_t x130;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x131;
    uint64_t x132;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x133;
    uint64_t x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x140;
    uint64_t x141;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x142;
    uint64_t x143;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x144;
    uint64_t x145;
    uint64_t x146;
    uint64_t x147;
    uint64_t x148;
    uint64_t x149;
    uint64_t x150;
    uint64_t x151;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x152;
    uint64_t x153;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x154;
    uint64_t x155;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x156;
    uint64_t x157;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x158;
    uint64_t x159;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x160;
    uint64_t x161;
    uint64_t x162;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x163;
    uint64_t x164;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x165;
    uint64_t x166;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x167;
    uint64_t x168;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x169;
    uint64_t x170;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x171;
    uint64_t x172;
    uint64_t x173;
    uint64_t x174;
    uint64_t x175;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x5, &x6, x4, (arg1[3]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x7, &x8, x4, (arg1[2]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x9, &x10, x4, (arg1[1]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x11, &x12, x4, (arg1[0]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x13, &x14, 0x0, x12, x9);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x15, &x16, x14, x10, x7);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x17, &x18, x16, x8, x5);
    x19 = (x18 + x6);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x20, &x21, x11,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x22, &x23, x20,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x24, &x25, x20,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x26, &x27, 0x0, x11,
                                                      x24);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x28, &x29, x27, x13,
                                                      x25);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x30, &x31, x29, x15,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x32, &x33, x31, x17,
                                                      x22);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x34, &x35, x33, x19,
                                                      x23);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x36, &x37, x1, (arg1[3]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x38, &x39, x1, (arg1[2]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x40, &x41, x1, (arg1[1]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x42, &x43, x1, (arg1[0]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x44, &x45, 0x0, x43,
                                                      x40);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x46, &x47, x45, x41,
                                                      x38);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x48, &x49, x47, x39,
                                                      x36);
    x50 = (x49 + x37);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x51, &x52, 0x0, x28,
                                                      x42);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x53, &x54, x52, x30,
                                                      x44);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x55, &x56, x54, x32,
                                                      x46);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x57, &x58, x56, x34,
                                                      x48);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x59, &x60, x58, x35,
                                                      x50);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x61, &x62, x51,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x63, &x64, x61,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x65, &x66, x61,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x67, &x68, 0x0, x51,
                                                      x65);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x69, &x70, x68, x53,
                                                      x66);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x71, &x72, x70, x55,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x73, &x74, x72, x57,
                                                      x63);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x75, &x76, x74, x59,
                                                      x64);
    x77 = ((uint64_t)x76 + x60);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x78, &x79, x2, (arg1[3]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x80, &x81, x2, (arg1[2]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x82, &x83, x2, (arg1[1]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x84, &x85, x2, (arg1[0]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x86, &x87, 0x0, x85,
                                                      x82);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x88, &x89, x87, x83,
                                                      x80);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x90, &x91, x89, x81,
                                                      x78);
    x92 = (x91 + x79);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x93, &x94, 0x0, x69,
                                                      x84);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x95, &x96, x94, x71,
                                                      x86);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x97, &x98, x96, x73,
                                                      x88);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x99, &x100, x98, x75,
                                                      x90);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x101, &x102, x100, x77,
                                                      x92);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x103, &x104, x93,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x105, &x106, x103,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x107, &x108, x103,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x109, &x110, 0x0, x93,
                                                      x107);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x111, &x112, x110, x95,
                                                      x108);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x113, &x114, x112, x97,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x115, &x116, x114, x99,
                                                      x105);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x117, &x118, x116, x101,
                                                      x106);
    x119 = ((uint64_t)x118 + x102);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x120, &x121, x3, (arg1[3]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x122, &x123, x3, (arg1[2]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x124, &x125, x3, (arg1[1]));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x126, &x127, x3, (arg1[0]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x128, &x129, 0x0, x127,
                                                      x124);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x130, &x131, x129, x125,
                                                      x122);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x132, &x133, x131, x123,
                                                      x120);
    x134 = (x133 + x121);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x135, &x136, 0x0, x111,
                                                      x126);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x137, &x138, x136, x113,
                                                      x128);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x139, &x140, x138, x115,
                                                      x130);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x141, &x142, x140, x117,
                                                      x132);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x143, &x144, x142, x119,
                                                      x134);
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x145, &x146, x135,
                                                 UINT64_C(0xdbf951d5883b2b2f));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x147, &x148, x145,
                                                 UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_mulx_u64(&x149, &x150, x145,
                                                 UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x151, &x152, 0x0, x135,
                                                      x149);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x153, &x154, x152, x137,
                                                      x150);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x155, &x156, x154, x139,
                                                      0x0);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x157, &x158, x156, x141,
                                                      x147);
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x159, &x160, x158, x143,
                                                      x148);
    x161 = ((uint64_t)x160 + x144);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x162, &x163, 0x0, x153,
                                                       UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x164, &x165, x163, x155,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x166, &x167, x165, x157,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(
        &x168, &x169, x167, x159, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x170, &x171, x169, x161,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x172, x171, x162, x153);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x173, x171, x164, x155);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x174, x171, x166, x157);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x175, x171, x168, x159);
    out1[0] = x172;
    out1[1] = x173;
    out1[2] = x174;
    out1[3] = x175;
}